

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<fmt::v7::detail::buffer<char>_>
fmt::v7::detail::write<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
          (back_insert_iterator<fmt::v7::detail::buffer<char>_> out,char *value)

{
  size_t sVar1;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar2;
  format_error *this;
  
  if (value != (char *)0x0) {
    sVar1 = strlen(value);
    bVar2 = std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<char_const*,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                      (value,value + sVar1,out);
    return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)bVar2.container;
  }
  this = (format_error *)__cxa_allocate_exception(0x10);
  format_error::format_error(this,"string pointer is null");
  __cxa_throw(this,&format_error::typeinfo,format_error::~format_error);
}

Assistant:

OutputIt write(OutputIt out, const Char* value) {
  if (!value) {
    FMT_THROW(format_error("string pointer is null"));
  } else {
    auto length = std::char_traits<Char>::length(value);
    out = write(out, basic_string_view<Char>(value, length));
  }
  return out;
}